

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O3

bpf_insn * icode_to_fcode(compiler_state_t *cstate,icode *ic,block *root,u_int *lenp)

{
  size_t __size;
  u_int uVar1;
  int iVar2;
  bpf_insn *__s;
  conv_state_t conv_state;
  conv_state_t local_40;
  
  while( true ) {
    ic->cur_mark = ic->cur_mark + 1;
    uVar1 = count_stmts(ic,root);
    *lenp = uVar1;
    __size = (ulong)uVar1 * 8;
    __s = (bpf_insn *)malloc(__size);
    if (__s == (bpf_insn *)0x0) {
      bpf_error(cstate,"malloc");
    }
    memset(__s,0,__size);
    local_40.ftail = __s + uVar1;
    ic->cur_mark = ic->cur_mark + 1;
    local_40.fstart = __s;
    iVar2 = convert_code_r(cstate,&local_40,ic,root);
    if (iVar2 != 0) break;
    free(__s);
  }
  return __s;
}

Assistant:

struct bpf_insn *
icode_to_fcode(compiler_state_t *cstate, struct icode *ic,
    struct block *root, u_int *lenp)
{
	u_int n;
	struct bpf_insn *fp;
	conv_state_t conv_state;

	/*
	 * Loop doing convert_code_r() until no branches remain
	 * with too-large offsets.
	 */
	while (1) {
	    unMarkAll(ic);
	    n = *lenp = count_stmts(ic, root);

	    fp = (struct bpf_insn *)malloc(sizeof(*fp) * n);
	    if (fp == NULL)
		    bpf_error(cstate, "malloc");
	    memset((char *)fp, 0, sizeof(*fp) * n);
	    conv_state.fstart = fp;
	    conv_state.ftail = fp + n;

	    unMarkAll(ic);
	    if (convert_code_r(cstate, &conv_state, ic, root))
		break;
	    free(fp);
	}

	return fp;
}